

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber_test.cc
# Opt level: O0

void __thiscall KyberTest_TestVectors_Test::TestBody(KyberTest_TestVectors_Test *this)

{
  function<void_(FileTest_*)> local_30;
  KyberTest_TestVectors_Test *local_10;
  KyberTest_TestVectors_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,KyberFileTest);
  FileTestGTest("crypto/kyber/kyber_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(KyberTest, TestVectors) {
  FileTestGTest("crypto/kyber/kyber_tests.txt", KyberFileTest);
}